

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_stoch.c
# Opt level: O3

TA_RetCode
referenceStoch(TA_Integer startIdx,TA_Integer endIdx,TA_Real *inHigh,TA_Real *inLow,TA_Real *inClose
              ,TA_Integer optInPeriod_0,TA_Integer optInPeriod_1,TA_Integer optInMAType_1,
              TA_Integer optInPeriod_2,TA_Integer optInMAType_2,TA_Integer *outBegIdx,
              TA_Integer *outNbElement,TA_Real *outSlowK_0,TA_Real *outSlowD_1)

{
  bool bVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  TA_RetCode TVar7;
  TA_Real *inReal;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  TA_Real TVar13;
  TA_Real TVar14;
  TA_Real TVar15;
  double dVar16;
  TA_Real TVar17;
  
  iVar3 = TA_MA_Lookback(optInPeriod_1,optInMAType_1);
  iVar4 = TA_MA_Lookback(optInPeriod_2,optInMAType_2);
  iVar5 = iVar3 + optInPeriod_0 + -1 + iVar4;
  if (startIdx < iVar5) {
    startIdx = iVar5;
  }
  if (endIdx < startIdx) {
    TVar7 = TA_SUCCESS;
    *outBegIdx = 0;
    *outNbElement = 0;
  }
  else {
    iVar11 = (startIdx - iVar5) + optInPeriod_0 + -1;
    bVar1 = true;
    inReal = outSlowK_0;
    if (((((outSlowK_0 != inClose) && (outSlowK_0 != inHigh)) && (outSlowK_0 != inLow)) &&
        ((inReal = outSlowD_1, outSlowD_1 != inClose && (outSlowD_1 != inHigh)))) &&
       (outSlowD_1 != inLow)) {
      inReal = (TA_Real *)malloc((long)((endIdx - iVar11) + 1) << 3);
      bVar1 = false;
    }
    uVar10 = 0xffffffff;
    if (iVar11 <= endIdx) {
      iVar6 = (startIdx - (optInPeriod_0 + iVar3 + iVar4)) + 2;
      lVar8 = (long)iVar11;
      lVar9 = (long)(startIdx - iVar5);
      uVar2 = 0;
      do {
        uVar10 = uVar2;
        TVar14 = inLow[lVar9];
        TVar13 = inHigh[lVar9];
        if (lVar9 < lVar8) {
          lVar12 = 0;
          TVar15 = TVar14;
          TVar17 = TVar13;
          do {
            TVar14 = inLow[iVar6 + lVar12];
            if (TVar15 <= inLow[iVar6 + lVar12]) {
              TVar14 = TVar15;
            }
            TVar13 = inHigh[iVar6 + lVar12];
            if (inHigh[iVar6 + lVar12] <= TVar17) {
              TVar13 = TVar17;
            }
            lVar12 = lVar12 + 1;
            TVar15 = TVar14;
            TVar17 = TVar13;
          } while (optInPeriod_0 + -1 != (int)lVar12);
        }
        dVar16 = 100.0;
        if (0.0 < TVar13 - TVar14) {
          dVar16 = ((inClose[lVar8] - TVar14) / (TVar13 - TVar14)) * 100.0;
        }
        lVar9 = lVar9 + 1;
        inReal[uVar10] = dVar16;
        lVar8 = lVar8 + 1;
        iVar6 = iVar6 + 1;
        uVar2 = uVar10 + 1;
      } while (uVar10 + 1 != (ulong)(((iVar3 + iVar4 + endIdx) - startIdx) + 1));
    }
    TVar7 = TA_MA(0,(int)uVar10,inReal,optInPeriod_1,optInMAType_1,outBegIdx,outNbElement,inReal);
    if ((TVar7 == TA_SUCCESS) && (*outNbElement != 0)) {
      TVar7 = TA_MA(0,*outNbElement + -1,inReal,optInPeriod_2,optInMAType_2,outBegIdx,outNbElement,
                    outSlowD_1);
      memmove(outSlowK_0,inReal + iVar4,(long)*outNbElement << 3);
      if (!bVar1) {
        free(inReal);
      }
      if (TVar7 == TA_SUCCESS) {
        *outBegIdx = startIdx;
        return TA_SUCCESS;
      }
    }
    else if (!bVar1) {
      free(inReal);
    }
    *outBegIdx = 0;
    *outNbElement = 0;
  }
  return TVar7;
}

Assistant:

static TA_RetCode referenceStoch( TA_Integer    startIdx,
                     TA_Integer    endIdx,
                     const TA_Real inHigh[],
                     const TA_Real inLow[],
                     const TA_Real inClose[],
                     TA_Integer    optInPeriod_0, /* From 1 to TA_INTEGER_MAX */
                     TA_Integer    optInPeriod_1, /* From 1 to TA_INTEGER_MAX */
                     TA_Integer    optInMAType_1,
                     TA_Integer    optInPeriod_2, /* From 1 to TA_INTEGER_MAX */
                     TA_Integer    optInMAType_2,
                     TA_Integer   *outBegIdx,
                     TA_Integer   *outNbElement,
                     TA_Real       outSlowK_0[],
                     TA_Real       outSlowD_1[] )
{
   TA_RetCode retCode;
   double Lt, Ht, tmp, *tempBuffer;
   int outIdx;
   int lookbackTotal, lookbackK, lookbackKSlow, lookbackDSlow;
   int trailingIdx, today, i, bufferIsAllocated;

   /* Identify the lookback needed. */
   lookbackK      = optInPeriod_0-1;
   lookbackKSlow  = TA_MA_Lookback( optInPeriod_1, (TA_MAType)optInMAType_1 );
   lookbackDSlow  = TA_MA_Lookback( optInPeriod_2, (TA_MAType)optInMAType_2 );
   lookbackTotal  = lookbackK + lookbackDSlow + lookbackKSlow;

   /* Move up the start index if there is not
    * enough initial data.
    */
   if( startIdx < lookbackTotal )
      startIdx = lookbackTotal;

   /* Make sure there is still something to evaluate. */
   if( startIdx > endIdx )
   {
      /* Succeed... but no data in the output. */
      *outBegIdx    = 0;
      *outNbElement = 0;
      return TA_SUCCESS;
   }

   /* Do the K calculation:
    *
    *    Kt = 100 x ((Ct-Lt)/(Ht-Lt))
    *
    * Kt is today stochastic
    * Ct is today closing price.
    * Lt is the lowest price of the last K Period (including today)
    * Ht is the highest price of the last K Period (including today)
    */

   /* Proceed with the calculation for the requested range.
    * Note that this algorithm allows the input and
    * output to be the same buffer.
    */
   outIdx = 0;

   /* Calculate just enough K for ending up with the caller
    * requested range. (The range of k must consider all
    * the lookback involve with the smoothing).
    */
   trailingIdx = startIdx-lookbackTotal;
   today       = trailingIdx+lookbackK;

   /* Allocate a temporary buffer large enough to
    * store the K.
    *
    * If the output is the same as the input, great
    * we just save ourself one memory allocation.
    */
   bufferIsAllocated = 0;
   if( (outSlowK_0 == inHigh) ||
       (outSlowK_0 == inLow)  ||
       (outSlowK_0 == inClose) )
   {
      tempBuffer = outSlowK_0;
   }
   else if( (outSlowD_1 == inHigh) ||
            (outSlowD_1 == inLow)  ||
            (outSlowD_1 == inClose) )
   {
      tempBuffer = outSlowD_1;
   }
   else
   {
      bufferIsAllocated = 1;
      tempBuffer = TA_Malloc( (endIdx-today+1)*sizeof(TA_Real) );
   }

   /* Do the K calculation */
   while( today <= endIdx )
   {
      /* Find Lt and Ht for the requested K period. */
      Lt = inLow [trailingIdx];
      Ht = inHigh[trailingIdx];
      trailingIdx++;
      for( i=trailingIdx; i <= today; i++ )
      {
         tmp = inLow[i];
         if( tmp < Lt ) Lt = tmp;
         tmp = inHigh[i];
         if( tmp > Ht ) Ht = tmp;
      }

      /* Calculate stochastic. */
      tmp = Ht-Lt;
      if( tmp > 0.0 )
        tempBuffer[outIdx++] = 100.0*((inClose[today]-Lt)/tmp);
      else
        tempBuffer[outIdx++] = 100.0;

      today++;
   }

   /* Un-smoothed K calculation completed. This K calculation is not returned
    * to the caller. It is always smoothed and then return.
    * Some documentation will refer to the smoothed version as being
    * "K-Slow", but often this end up to be shorten to "K".
    */
   retCode = TA_MA( 0, outIdx-1,
                    tempBuffer, optInPeriod_1,
                    (TA_MAType)optInMAType_1,
                    outBegIdx, outNbElement, tempBuffer );


   if( (retCode != TA_SUCCESS) || (*outNbElement == 0) )
   {
      if( bufferIsAllocated )
        TA_Free(  tempBuffer );
      /* Something wrong happen? No further data? */
      *outBegIdx    = 0;
      *outNbElement = 0;
      return retCode;
   }

   /* Calculate the %D which is simply a moving average of
    * the already smoothed %K.
    */
   retCode = TA_MA( 0, (*outNbElement)-1,
                    tempBuffer, optInPeriod_2,
                    (TA_MAType)optInMAType_2,
                    outBegIdx, outNbElement, outSlowD_1 );

   /* Copy tempBuffer into the caller buffer.
    * (Calculation could not be done directly in the
    *  caller buffer because more input data then the
    *  requested range was needed for doing %D).
    */
   memmove( outSlowK_0, &tempBuffer[lookbackDSlow], (*outNbElement) * sizeof(TA_Real) );

   /* Don't need K anymore, free it if it was allocated here. */
   if( bufferIsAllocated )
      TA_Free(  tempBuffer );

   if( retCode != TA_SUCCESS )
   {
      /* Something wrong happen while processing %D? */
      *outBegIdx    = 0;
      *outNbElement = 0;
      return retCode;
   }

   /* Note: Keep the outBegIdx relative to the
    *       caller input before returning.
    */
   *outBegIdx = startIdx;

   return TA_SUCCESS;
}